

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O3

void Abc_FrameGiaInputMiniAig(Abc_Frame_t *pAbc,void *p)

{
  Vec_Int_t **pvCopies;
  Gia_Man_t *pGVar1;
  Vec_Int_t *__ptr;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    puts("ABC framework is not initialized by calling Abc_Start()");
  }
  Gia_ManStopP(&pAbc->pGiaMiniAig);
  pvCopies = &pAbc->vCopyMiniAig;
  __ptr = pAbc->vCopyMiniAig;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      (*pvCopies)->pArray = (int *)0x0;
      __ptr = *pvCopies;
      if (__ptr == (Vec_Int_t *)0x0) goto LAB_0077fffc;
    }
    free(__ptr);
    *pvCopies = (Vec_Int_t *)0x0;
  }
LAB_0077fffc:
  pGVar1 = Gia_ManFromMiniAig((Mini_Aig_t *)p,pvCopies);
  Abc_FrameUpdateGia(pAbc,pGVar1);
  pGVar1 = Gia_ManDup(pGVar1);
  pAbc->pGiaMiniAig = pGVar1;
  return;
}

Assistant:

void Abc_FrameGiaInputMiniAig( Abc_Frame_t * pAbc, void * p )
{
    Gia_Man_t * pGia;
    if ( pAbc == NULL )
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
    Gia_ManStopP( &pAbc->pGiaMiniAig );
    Vec_IntFreeP( &pAbc->vCopyMiniAig );
    pGia = Gia_ManFromMiniAig( (Mini_Aig_t *)p, &pAbc->vCopyMiniAig );
    Abc_FrameUpdateGia( pAbc, pGia );
    pAbc->pGiaMiniAig = Gia_ManDup( pGia );
//    Gia_ManDelete( pGia );
}